

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  uchar uVar4;
  int iVar2;
  size_t sVar3;
  uchar uVar7;
  size_t sVar5;
  LodePNGColorMode *pLVar6;
  uint bits;
  uint uVar8;
  uchar uVar9;
  uchar uVar10;
  unsigned_short grey;
  uchar uVar12;
  ulong uVar11;
  long lVar13;
  ulong uVar14;
  long lVar15;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ulong local_d0;
  LodePNGColorMode *local_c8;
  LodePNGColorMode *local_c0;
  ColorTree tree;
  
  iVar2 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar2 != 0) {
    sVar3 = lodepng_get_raw_size(w,h,mode_in);
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      out[sVar5] = in[sVar5];
    }
    return 0;
  }
  local_d0 = (ulong)(h * w);
  local_c8 = mode_in;
  local_c0 = mode_out;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar11 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    uVar14 = mode_out->palettesize;
    pLVar6 = mode_out;
    if (uVar14 == 0) {
      uVar14 = mode_in->palettesize;
      pLVar6 = mode_in;
    }
    puVar1 = pLVar6->palette;
    if (uVar14 < uVar11) {
      uVar11 = uVar14;
    }
    color_tree_init(&tree);
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      color_tree_add(&tree,puVar1[uVar14 * 4],puVar1[uVar14 * 4 + 1],puVar1[uVar14 * 4 + 2],
                     puVar1[uVar14 * 4 + 3],(uint)uVar14);
    }
  }
  pLVar6 = local_c0;
  if (local_c0->bitdepth == 0x10 && local_c8->bitdepth == 0x10) {
    lVar13 = 5;
    for (sVar3 = 0; pLVar6 = local_c0, local_d0 != sVar3; sVar3 = sVar3 + 1) {
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      getPixelColorRGBA16(&r,&g,&b,&a,in,sVar3,local_c8);
      uVar10 = (uchar)r;
      uVar12 = (uchar)(r >> 8);
      uVar7 = (uchar)(a >> 8);
      uVar9 = (uchar)(g >> 8);
      uVar4 = (uchar)(b >> 8);
      switch(pLVar6->colortype) {
      case LCT_GREY:
        *(unsigned_short *)(out + sVar3 * 2) = r << 8 | r >> 8;
        break;
      case LCT_RGB:
        out[lVar13 + -5] = uVar12;
        out[lVar13 + -4] = uVar10;
        out[lVar13 + -3] = uVar9;
        out[lVar13 + -2] = (uchar)g;
        out[lVar13 + -1] = uVar4;
        out[lVar13] = (uchar)b;
        break;
      case LCT_GREY_ALPHA:
        out[sVar3 * 4] = uVar12;
        out[sVar3 * 4 + 1] = uVar10;
        out[sVar3 * 4 + 2] = uVar7;
        out[sVar3 * 4 + 3] = (uchar)a;
        break;
      case LCT_RGBA:
        out[sVar3 * 8] = uVar12;
        out[sVar3 * 8 + 1] = uVar10;
        out[sVar3 * 8 + 2] = uVar9;
        out[sVar3 * 8 + 3] = (uchar)g;
        out[sVar3 * 8 + 4] = uVar4;
        out[sVar3 * 8 + 5] = (uchar)b;
        out[sVar3 * 8 + 6] = uVar7;
        out[sVar3 * 8 + 7] = (uchar)a;
      }
      lVar13 = lVar13 + 6;
    }
    goto LAB_0011d2f6;
  }
  if (local_c0->bitdepth == 8) {
    if (local_c0->colortype == LCT_RGB) {
      uVar8 = 0;
    }
    else {
      if (local_c0->colortype != LCT_RGBA) goto LAB_0011d10c;
      uVar8 = 1;
    }
    getPixelColorsRGBA8(out,local_d0,uVar8,in,local_c8);
  }
  else {
LAB_0011d10c:
    r = r & 0xff00;
    g = g & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    lVar13 = 2;
    lVar15 = 5;
    for (sVar3 = 0; local_d0 != sVar3; sVar3 = sVar3 + 1) {
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,in,sVar3,local_c8);
      switch(pLVar6->colortype) {
      case LCT_GREY:
        bits = pLVar6->bitdepth;
        if (bits == 0x10) {
          out[sVar3 * 2 + 1] = (byte)r;
          out[sVar3 * 2] = (byte)r;
        }
        else {
          if (bits != 8) {
            uVar8 = ~(-1 << ((byte)bits & 0x1f)) & (uint)((byte)r >> (8 - (byte)bits & 0x1f));
            goto LAB_0011d2c7;
          }
          out[sVar3] = (byte)r;
        }
        break;
      case LCT_RGB:
        if (pLVar6->bitdepth == 8) {
          out[lVar13 + -2] = (byte)r;
          out[lVar13 + -1] = (uchar)g;
          out[lVar13] = (uchar)b;
        }
        else {
          out[lVar15 + -4] = (byte)r;
          out[lVar15 + -5] = (byte)r;
          out[lVar15 + -2] = (uchar)g;
          out[lVar15 + -3] = (uchar)g;
          out[lVar15] = (uchar)b;
          out[lVar15 + -1] = (uchar)b;
        }
        break;
      case LCT_PALETTE:
        uVar8 = color_tree_get(&tree,(byte)r,(uchar)g,(uchar)b,(uchar)a);
        if ((int)uVar8 < 0) {
          return 0x52;
        }
        bits = pLVar6->bitdepth;
        if (bits == 8) {
          out[sVar3] = (uchar)uVar8;
        }
        else {
LAB_0011d2c7:
          addColorBits(out,sVar3,bits,uVar8);
        }
        break;
      case LCT_GREY_ALPHA:
        if (pLVar6->bitdepth == 0x10) {
          out[sVar3 * 4 + 1] = (byte)r;
          out[sVar3 * 4] = (byte)r;
          out[sVar3 * 4 + 3] = (uchar)a;
          out[sVar3 * 4 + 2] = (uchar)a;
        }
        else if (pLVar6->bitdepth == 8) {
          out[sVar3 * 2] = (byte)r;
          out[sVar3 * 2 + 1] = (uchar)a;
        }
        break;
      case LCT_RGBA:
        if (pLVar6->bitdepth == 8) {
          out[sVar3 * 4] = (byte)r;
          out[sVar3 * 4 + 1] = (uchar)g;
          out[sVar3 * 4 + 2] = (uchar)b;
          out[sVar3 * 4 + 3] = (uchar)a;
        }
        else {
          out[sVar3 * 8 + 1] = (byte)r;
          out[sVar3 * 8] = (byte)r;
          out[sVar3 * 8 + 3] = (uchar)g;
          out[sVar3 * 8 + 2] = (uchar)g;
          out[sVar3 * 8 + 5] = (uchar)b;
          out[sVar3 * 8 + 4] = (uchar)b;
          out[sVar3 * 8 + 7] = (uchar)a;
          out[sVar3 * 8 + 6] = (uchar)a;
        }
      }
      lVar13 = lVar13 + 3;
      lVar15 = lVar15 + 6;
    }
  }
LAB_0011d2f6:
  if (pLVar6->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}